

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlReadDoc(xmlChar *str,char *url,char *encoding,int options)

{
  htmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  htmlDocPtr pxVar1;
  
  ctxt = htmlNewParserCtxt();
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    pxVar1 = (htmlDocPtr)0x0;
  }
  else {
    htmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromString(ctxt,url,(char *)str,encoding,XML_INPUT_BUF_STATIC);
    if (input == (xmlParserInputPtr)0x0) {
      pxVar1 = (htmlDocPtr)0x0;
    }
    else {
      pxVar1 = htmlCtxtParseDocument(ctxt,input);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

htmlDocPtr
htmlReadDoc(const xmlChar *str, const char *url, const char *encoding,
            int options)
{
    htmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    htmlDocPtr doc = NULL;

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromString(ctxt, url, (const char *) str, encoding,
                                      XML_INPUT_BUF_STATIC);

    if (input != NULL)
        doc = htmlCtxtParseDocument(ctxt, input);

    htmlFreeParserCtxt(ctxt);
    return(doc);
}